

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O2

void __thiscall wasm::MergeBlocks::visitExpression(MergeBlocks *this,Expression *curr)

{
  ExpressionList *this_00;
  Block *pBVar1;
  size_t sVar2;
  bool bVar3;
  pointer pEVar4;
  Expression *pEVar5;
  bool bVar6;
  Expression **ppEVar7;
  Index i;
  Index index;
  undefined1 other [8];
  size_t sVar8;
  optional<wasm::Type> type_;
  Expression *local_260;
  EffectAnalyzer blockChildEffects;
  ChildIterator iterator;
  Expression *child;
  anon_class_24_3_515ba06b continueEarly;
  undefined1 local_90 [8];
  Iterator __begin3;
  undefined1 auStack_78 [8];
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> childEffects;
  Block *local_58;
  Expression *local_50;
  Expression *back;
  ExpressionList *__range4;
  uint local_34;
  
  if ((0x35 < (ulong)curr->_id) || ((0x3000000000000eU >> ((ulong)curr->_id & 0x3f) & 1) == 0)) {
    auStack_78 = (undefined1  [8])0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __range4 = (ExpressionList *)this;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)
               &blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
               curr);
    local_34 = 0xffffffff;
    for (index = 0;
        (int)((ulong)((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start -
                     (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                           _M_elems[3]) >> 3) +
        (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        index; index = index + 1) {
      ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::getChild
                          ((AbstractChildIterator<wasm::ChildIterator> *)
                           &blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,index);
      if ((*ppEVar7)->_id == BlockId) {
        local_34 = index;
      }
    }
    if (local_34 != 0xffffffff) {
      if (local_34 != 0) {
        std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::reserve
                  ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78
                   ,(ulong)local_34);
      }
      local_58 = (Block *)0x0;
      for (sVar8 = 0; (uint)sVar8 <= local_34; sVar8 = (size_t)((int)sVar8 + 1)) {
        ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::getChild
                            ((AbstractChildIterator<wasm::ChildIterator> *)
                             &blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,(uint)sVar8);
        pBVar1 = (Block *)*ppEVar7;
        child = (Expression *)auStack_78;
        continueEarly.childEffects =
             (vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)__range4;
        continueEarly.this =
             (MergeBlocks *)
             ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data + 0x10);
        iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pBVar1;
        if ((((pBVar1->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
              BlockId) && ((pBVar1->name).super_IString.str._M_str == (char *)0x0)) &&
           (1 < (pBVar1->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements)) {
          this_00 = &pBVar1->list;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              );
          local_50 = *ppEVar7;
          if ((pBVar1->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
              == (local_50->type).id) {
            __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
            continueEarly.child =
                 (Expression **)
                 (pBVar1->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements;
            bVar3 = false;
            local_90 = (undefined1  [8])this_00;
            __begin3.index = sVar8;
            back = (Expression *)this_00;
            while ((__begin3.parent != (ArenaVector<wasm::Expression_*> *)continueEarly.child ||
                   (local_90 != (undefined1  [8])back))) {
              ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        Iterator::operator*((Iterator *)local_90);
              if (*ppEVar7 == local_50) break;
              EffectAnalyzer::EffectAnalyzer
                        ((EffectAnalyzer *)&local_260,
                         (PassOptions *)
                         ((__range4->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ).usedElements + 0x30),
                         (Module *)
                         __range4[9].
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         usedElements,*ppEVar7);
              pEVar4 = childEffects.
                       super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              other = auStack_78;
              do {
                if (other == (undefined1  [8])pEVar4) goto LAB_00a96111;
                bVar6 = EffectAnalyzer::invalidates
                                  ((EffectAnalyzer *)&local_260,(EffectAnalyzer *)other);
                other = (undefined1  [8])((long)other + 0x160);
              } while (!bVar6);
              bVar3 = true;
LAB_00a96111:
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&local_260);
              if (bVar3) break;
              __begin3.parent =
                   (ArenaVector<wasm::Expression_*> *)
                   ((long)&((__begin3.parent)->
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ).data + 1);
            }
            sVar8 = __begin3.index;
            if (bVar3) {
              visitExpression::anon_class_24_3_515ba06b::operator()
                        ((anon_class_24_3_515ba06b *)&child);
              sVar8 = __begin3.index;
            }
            else {
              if (local_58 == (Block *)0x0) {
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           back);
                local_58 = pBVar1;
              }
              else {
                local_260 = back;
                blockChildEffects.ignoreImplicitTraps = false;
                blockChildEffects.trapsNeverHappen = false;
                blockChildEffects._2_6_ = 0;
                sVar2 = (pBVar1->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements;
                while ((blockChildEffects._0_8_ != sVar2 || (local_260 != back))) {
                  ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            Iterator::operator*((Iterator *)&local_260);
                  if (*ppEVar7 == local_50) break;
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            (&(local_58->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,*ppEVar7);
                  blockChildEffects._0_8_ = blockChildEffects._0_8_ + 1;
                }
              }
              pEVar5 = local_50;
              ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::getChild
                                  ((AbstractChildIterator<wasm::ChildIterator> *)
                                   &blockChildEffects.delegateTargets._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count,(uint)sVar8);
              *ppEVar7 = pEVar5;
              if ((uint)sVar8 < local_34) {
                std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                          ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                           auStack_78,
                           (PassOptions *)
                           ((__range4->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ).usedElements + 0x30),
                           (Module *)
                           __range4[9].
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           .usedElements,&local_50);
              }
            }
          }
          else {
            visitExpression::anon_class_24_3_515ba06b::operator()
                      ((anon_class_24_3_515ba06b *)&child);
          }
        }
        else {
          visitExpression::anon_class_24_3_515ba06b::operator()((anon_class_24_3_515ba06b *)&child);
        }
      }
      if (local_58 != (Block *)0x0) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(local_58->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,curr)
        ;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)(curr->type).id;
        Block::finalize(local_58,type_,Unknown);
        Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
        replaceCurrent((Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                        *)&__range4[2].allocator,(Expression *)local_58);
        *(undefined1 *)
         &__range4[9].super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          allocatedElements = 1;
      }
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
               (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems +
               3));
    std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
              ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Control flow need special handling. Those we can optimize are handled
    // below.
    if (Properties::isControlFlowStructure(curr)) {
      return;
    }

    // As we go through the children, to move things to the outside means
    // moving them past the children before them:
    //
    //  (parent
    //   (child1
    //    (A)
    //    (B)
    //   )
    //   (child2
    //
    // If we move (A) out of parent, then that is fine (further things moved
    // out would appear after it). But if we leave (B) in its current position
    // then if we try to move anything from child2 out of parent then we must
    // move those things past (B). We use a vector to track the effects of the
    // children, where it contains the effects of what was left in the child
    // after optimization.
    std::vector<EffectAnalyzer> childEffects;

    ChildIterator iterator(curr);
    auto numChildren = iterator.getNumChildren();

    // Find the last block among the children, as all we are trying to do here
    // is move the contents of blocks outwards.
    Index lastBlock = -1;
    for (Index i = 0; i < numChildren; i++) {
      if (iterator.getChild(i)->is<Block>()) {
        lastBlock = i;
      }
    }
    if (lastBlock == Index(-1)) {
      // There are no blocks at all, so there is nothing to optimize.
      return;
    }

    // We'll only compute effects up to the child before the last block, since
    // we have nothing to optimize afterwards, which sets a maximum size on the
    // vector.
    if (lastBlock > 0) {
      childEffects.reserve(lastBlock);
    }

    // The outer block that will replace us, containing the contents moved out
    // and then ourselves, assuming we manage to optimize.
    Block* outerBlock = nullptr;

    for (Index i = 0; i <= lastBlock; i++) {
      auto* child = iterator.getChild(i);
      auto* block = child->dynCast<Block>();

      auto continueEarly = [&]() {
        // When we continue early, after failing to find anything to optimize,
        // the effects we need to note for the child are simply those of the
        // child in its original form.
        childEffects.emplace_back(getPassOptions(), *getModule(), child);
      };

      // If there is no block, or it is one that might have branches, or it is
      // too small for us to remove anything from (we cannot remove the last
      // element), or if it has unreachable code (leave that for dce), then give
      // up.
      if (!block || block->name.is() || block->list.size() <= 1) {
        continueEarly();
        continue;
      }

      // Also give up if the block's last element has a different type than the
      // block, as that would mean we would change the type received by the
      // parent (which might cause its type to need to be updated, for example).
      // Leave this alone, as other passes will simplify this anyhow (using
      // refinalize).
      auto* back = block->list.back();
      if (block->type != back->type) {
        continueEarly();
        continue;
      }

      // The block seems to have the shape we want. Check for effects: we want
      // to move all the items out but the last one, so they must all cross over
      // anything we need to move past.
      //
      // In principle we could also handle the case where we can move out only
      // some of the block items. However, that would be more complex (we'd need
      // to allocate a new block sometimes), it is rare, and it may not always
      // be helpful (we wouldn't actually be getting rid of the child block -
      // although, in the binary format such blocks tend to vanish anyhow).
      bool fail = false;
      for (auto* blockChild : block->list) {
        if (blockChild == back) {
          break;
        }
        EffectAnalyzer blockChildEffects(
          getPassOptions(), *getModule(), blockChild);
        for (auto& effects : childEffects) {
          if (blockChildEffects.invalidates(effects)) {
            fail = true;
            break;
          }
        }
        if (fail) {
          break;
        }
      }
      if (fail) {
        continueEarly();
        continue;
      }

      // Wonderful, we can do this! Move our items to an outer block, reusing
      // this one if there isn't one already.
      if (!outerBlock) {
        // Leave all the items there, just remove the last one which will remain
        // where it was.
        block->list.pop_back();
        outerBlock = block;
      } else {
        // Move the items to the existing outer block.
        for (auto* blockChild : block->list) {
          if (blockChild == back) {
            break;
          }
          outerBlock->list.push_back(blockChild);
        }
      }

      // Set the back element as the new child, replacing the block that was
      // there.
      iterator.getChild(i) = back;

      // If there are further elements, we need to know what effects the
      // remaining code has, as if they move they'll move past it.
      if (i < lastBlock) {
        childEffects.emplace_back(getPassOptions(), *getModule(), back);
      }
    }

    if (outerBlock) {
      // We moved items outside, which means we must replace ourselves with the
      // block.
      outerBlock->list.push_back(curr);
      outerBlock->finalize(curr->type);
      replaceCurrent(outerBlock);
      refinalize = true;
    }
  }